

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

uint fmt::v5::internal::
     parse_nonnegative_int<fmt::v5::internal::null_terminating_iterator<char>,fmt::v5::internal::width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>>&,char>&>
               (null_terminating_iterator<char> *it,
               width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_>_&,_char>
               *eh)

{
  char cVar1;
  null_terminating_iterator<char> *in_RDI;
  null_terminating_iterator<char> next;
  uint big;
  uint max_int;
  uint value;
  uint in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_>_&,_char>
  *this;
  null_terminating_iterator<char> in_stack_ffffffffffffffc0;
  null_terminating_iterator<char> local_30;
  uint local_1c;
  uint local_18;
  uint local_14;
  null_terminating_iterator<char> *local_8;
  
  local_14 = 0;
  local_8 = in_RDI;
  local_18 = std::numeric_limits<int>::max();
  local_1c = local_18 / 10;
  do {
    this = (width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_>_&,_char>
            *)in_stack_ffffffffffffffc0.ptr_;
    if (local_1c < local_14) {
      local_14 = local_18 + 1;
      break;
    }
    in_stack_ffffffffffffffbc = local_14 * 10;
    cVar1 = null_terminating_iterator<char>::operator*(local_8);
    local_14 = in_stack_ffffffffffffffbc + cVar1 + -0x30;
    local_30.ptr_ = local_8->ptr_;
    local_30.end_ = local_8->end_;
    in_stack_ffffffffffffffc0 = null_terminating_iterator<char>::operator++(&local_30);
    local_8->ptr_ = local_30.ptr_;
    local_8->end_ = local_30.end_;
    cVar1 = null_terminating_iterator<char>::operator*(local_8);
    in_stack_ffffffffffffffb8 = in_stack_ffffffffffffffb8 & 0xffffff;
    if ('/' < cVar1) {
      cVar1 = null_terminating_iterator<char>::operator*(local_8);
      in_stack_ffffffffffffffb8 = CONCAT13(cVar1 < ':',(int3)in_stack_ffffffffffffffb8);
    }
    this = (width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_>_&,_char>
            *)in_stack_ffffffffffffffc0.ptr_;
  } while ((char)(in_stack_ffffffffffffffb8 >> 0x18) != '\0');
  if (local_18 < local_14) {
    width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_>_&,_char>
    ::on_error(this,(char *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  }
  return local_14;
}

Assistant:

FMT_CONSTEXPR unsigned parse_nonnegative_int(Iterator &it, ErrorHandler &&eh) {
  assert('0' <= *it && *it <= '9');
  unsigned value = 0;
  // Convert to unsigned to prevent a warning.
  unsigned max_int = (std::numeric_limits<int>::max)();
  unsigned big = max_int / 10;
  do {
    // Check for overflow.
    if (value > big) {
      value = max_int + 1;
      break;
    }
    value = value * 10 + unsigned(*it - '0');
    // Workaround for MSVC "setup_exception stack overflow" error:
    auto next = it;
    ++next;
    it = next;
  } while ('0' <= *it && *it <= '9');
  if (value > max_int)
    eh.on_error("number is too big");
  return value;
}